

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O0

bool __thiscall ON_NurbsCurve::SetDomain(ON_NurbsCurve *this,double t0,double t1)

{
  double dVar1;
  double dVar2;
  int iVar3;
  double dVar4;
  int local_50;
  int i;
  int knot_count;
  double km;
  double d;
  double k1;
  double k0;
  bool rc;
  double t1_local;
  double t0_local;
  ON_NurbsCurve *this_local;
  
  k0._7_1_ = false;
  if ((((1 < this->m_order) && (this->m_order <= this->m_cv_count)) &&
      (this->m_knot != (double *)0x0)) && (t0 < t1)) {
    dVar1 = this->m_knot[this->m_order + -2];
    dVar2 = this->m_knot[this->m_cv_count + -1];
    if (((dVar1 != t0) || (NAN(dVar1) || NAN(t0))) || ((dVar2 != t1 || (NAN(dVar2) || NAN(t1))))) {
      if (dVar1 < dVar2) {
        ON_Curve::DestroyCurveTree(&this->super_ON_Curve);
        dVar4 = (t1 - t0) / (dVar2 - dVar1);
        iVar3 = KnotCount(this);
        for (local_50 = 0; local_50 < iVar3; local_50 = local_50 + 1) {
          if ((dVar1 + dVar2) * 0.5 < this->m_knot[local_50]) {
            this->m_knot[local_50] = (this->m_knot[local_50] - dVar2) * dVar4 + t1;
          }
          else {
            this->m_knot[local_50] = (this->m_knot[local_50] - dVar1) * dVar4 + t0;
          }
        }
        k0._7_1_ = true;
      }
    }
    else {
      k0._7_1_ = true;
    }
  }
  return k0._7_1_;
}

Assistant:

bool ON_NurbsCurve::SetDomain( double t0, double t1 )
{
  bool rc = false;
  if ( m_order >= 2 && m_cv_count >= m_order && m_knot && t0 < t1 ) {
	 //DestroyCurveTree();
   const double k0 = m_knot[m_order-2];
    const double k1 = m_knot[m_cv_count-1];
    if ( k0 == t0 && k1 == t1 )
      rc = true;
    else if ( k0 < k1 ) 
    {
      DestroyCurveTree();
      const double d = (t1-t0)/(k1-k0);
      const double km = 0.5*(k0+k1);
      const int knot_count = KnotCount();
      int i;
      for ( i = 0; i < knot_count; i++ ) 
      {
        if ( m_knot[i] <= km ) {
          m_knot[i] = (m_knot[i] - k0)*d + t0;
        }
        else {
          m_knot[i] = (m_knot[i] - k1)*d + t1;
        }
      }
      rc = true;
    }
  }
  return rc;
}